

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int replace_escaped(char *in,size_t index,size_t *max)

{
  int iVar1;
  ushort **ppuVar2;
  size_t *local_40;
  size_t j;
  size_t i;
  char tempChar;
  size_t *psStack_28;
  int tempInt;
  size_t *max_local;
  size_t index_local;
  char *in_local;
  
  i._4_4_ = 0;
  i._3_1_ = 0;
  if (((in[index] == '%') &&
      (psStack_28 = max, max_local = (size_t *)index, index_local = (size_t)in,
      ppuVar2 = __ctype_b_loc(),
      ((*ppuVar2)[(int)*(char *)(index_local + 1 + (long)max_local)] & 0x1000) != 0)) &&
     (ppuVar2 = __ctype_b_loc(),
     ((*ppuVar2)[(int)*(char *)(index_local + 2 + (long)max_local)] & 0x1000) != 0)) {
    iVar1 = __isoc99_sscanf((long)max_local + index_local + 1,"%2x",(long)&i + 4);
    if (iVar1 != 1) {
      return 0;
    }
    i._3_1_ = (undefined1)i._4_4_;
    j = (long)max_local + 3;
    for (local_40 = max_local; local_40 < (size_t *)*psStack_28;
        local_40 = (size_t *)((long)local_40 + 1)) {
      *(undefined1 *)(index_local + (long)local_40) = i._3_1_;
      if (j < *psStack_28) {
        i._3_1_ = *(undefined1 *)(index_local + j);
      }
      else {
        i._3_1_ = 0;
      }
      j = j + 1;
    }
    *psStack_28 = *psStack_28 - 2;
    return 1;
  }
  return 0;
}

Assistant:

int replace_escaped(char *in, size_t index, size_t *max)
{
	int tempInt = 0;
	char tempChar = 0;
	size_t i = (size_t)0;
	size_t j = (size_t)0;

	if (in[index] == '%' && isxdigit(in[index + (size_t)1]) &&
		isxdigit(in[index + (size_t)2])) {
		/* Note the "%2x", makes sure that we convert a maximum of two
		 * characters. */
#ifdef _WIN32
		if (sscanf_s(&in[index + (size_t)1],
#else
		if (sscanf(&in[index + (size_t)1],
#endif
			    "%2x",
			    (unsigned int *)&tempInt) != 1) {
			return 0;
		}
		tempChar = (char)tempInt;
		for (i = index + (size_t)3, j = index; j < *max; i++, j++) {
			in[j] = tempChar;
			if (i < *max) {
				tempChar = in[i];
			} else {
				tempChar = 0;
			}
		}
		*max -= (size_t)2;
		return 1;
	} else {
		return 0;
	}
}